

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoDebugger.cpp
# Opt level: O0

void __thiscall NanoDebugger::NanoDebugger(NanoDebugger *this,string *file)

{
  string local_38;
  string *local_18;
  string *file_local;
  NanoDebugger *this_local;
  
  local_18 = file;
  file_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)file);
  NanoVM::NanoVM(&this->super_NanoVM,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            (&this->breakpoints);
  this->run = false;
  return;
}

Assistant:

NanoDebugger::NanoDebugger(std::string file) : NanoVM(file) {
	run = false;
}